

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro_data.cpp
# Opt level: O1

void skiwi::destroy_macro_data(macro_data *md)

{
  pointer ppVar1;
  pair<void_*,_unsigned_long> *f;
  pointer ppVar2;
  
  ppVar1 = (md->compiled_macros).
           super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (md->compiled_macros).
                super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    assembler::free_assembled_function(ppVar2->first,ppVar2->second);
  }
  ppVar2 = (md->compiled_macros).
           super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((md->compiled_macros).
      super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (md->compiled_macros).
    super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  return;
}

Assistant:

void destroy_macro_data(macro_data& md)
  {
#ifdef _SKIWI_FOR_ARM
    for (auto& f : md.compiled_macros)
      ASM::free_bytecode((void*)f.first, f.second);
    md.compiled_macros.clear();
#else
  for (auto& f : md.compiled_macros)
    ASM::free_assembled_function(f.first, f.second);
  md.compiled_macros.clear();
#endif
  }